

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O1

bool __thiscall sf::Texture::loadFromImage(Texture *this,Image *image,IntRect *area)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint width;
  bool bVar4;
  uint uVar5;
  Vector2u VVar6;
  Vector2u VVar7;
  Uint8 *pUVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  TransientContextLock lock;
  TextureSaver save;
  
  VVar6 = Image::getSize(image);
  VVar7 = Image::getSize(image);
  uVar1 = area->width;
  if ((uVar1 != 0) && (uVar2 = area->height, uVar2 != 0)) {
    iVar11 = area->left;
    iVar3 = area->top;
    uVar10 = VVar6.x;
    uVar5 = VVar7.y;
    if (((int)uVar2 < (int)uVar5 || (int)uVar1 < (int)uVar10) || (0 < iVar3 || 0 < iVar11)) {
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      iVar9 = 0;
      if (0 < iVar3) {
        iVar9 = iVar3;
      }
      width = uVar10 - iVar11;
      if ((int)(uVar1 + iVar11) <= (int)uVar10) {
        width = uVar1;
      }
      uVar1 = uVar5 - iVar9;
      if ((int)(iVar9 + uVar2) <= (int)uVar5) {
        uVar1 = uVar2;
      }
      bVar4 = create(this,width,uVar1);
      if (bVar4) {
        GlResource::TransientContextLock::TransientContextLock(&lock);
        priv::TextureSaver::TextureSaver(&save);
        pUVar8 = Image::getPixelsPtr(image);
        glBindTexture(0xde1,this->m_texture);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x121,"glBindTexture(GL_TEXTURE_2D, m_texture)");
        if (0 < (int)uVar1) {
          pUVar8 = pUVar8 + (int)((iVar9 * uVar10 + iVar11) * 4);
          iVar11 = 0;
          do {
            glTexSubImage2D(0xde1,0,0,iVar11,width,1,0x1908,0x1401,pUVar8);
            priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                               ,0x124,
                               "glTexSubImage2D(GL_TEXTURE_2D, 0, 0, i, rectangle.width, 1, GL_RGBA, GL_UNSIGNED_BYTE, pixels)"
                              );
            pUVar8 = pUVar8 + (int)(uVar10 << 2);
            iVar11 = iVar11 + 1;
          } while (iVar11 < (int)uVar1);
        }
        glTexParameteri(0xde1,0x2801,this->m_isSmooth | 0x2600);
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x128,
                           "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST)"
                          );
        this->m_hasMipmap = false;
        glFlush();
        priv::glCheckError("/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O1/_deps/sfml-src/src/SFML/Graphics/Texture.cpp"
                           ,0x12d,"glFlush()");
        priv::TextureSaver::~TextureSaver(&save);
        GlResource::TransientContextLock::~TransientContextLock(&lock);
        return bVar4;
      }
      return bVar4;
    }
  }
  VVar6 = Image::getSize(image);
  VVar7 = Image::getSize(image);
  bVar4 = create(this,VVar6.x,VVar7.y);
  if (bVar4) {
    update(this,image);
  }
  return bVar4;
}

Assistant:

bool Texture::loadFromImage(const Image& image, const IntRect& area)
{
    // Retrieve the image size
    int width = static_cast<int>(image.getSize().x);
    int height = static_cast<int>(image.getSize().y);

    // Load the entire image if the source area is either empty or contains the whole image
    if (area.width == 0 || (area.height == 0) ||
       ((area.left <= 0) && (area.top <= 0) && (area.width >= width) && (area.height >= height)))
    {
        // Load the entire image
        if (create(image.getSize().x, image.getSize().y))
        {
            update(image);

            return true;
        }
        else
        {
            return false;
        }
    }
    else
    {
        // Load a sub-area of the image

        // Adjust the rectangle to the size of the image
        IntRect rectangle = area;
        if (rectangle.left   < 0) rectangle.left = 0;
        if (rectangle.top    < 0) rectangle.top  = 0;
        if (rectangle.left + rectangle.width > width)  rectangle.width  = width - rectangle.left;
        if (rectangle.top + rectangle.height > height) rectangle.height = height - rectangle.top;

        // Create the texture and upload the pixels
        if (create(rectangle.width, rectangle.height))
        {
            TransientContextLock lock;

            // Make sure that the current texture binding will be preserved
            priv::TextureSaver save;

            // Copy the pixels to the texture, row by row
            const Uint8* pixels = image.getPixelsPtr() + 4 * (rectangle.left + (width * rectangle.top));
            glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
            for (int i = 0; i < rectangle.height; ++i)
            {
                glCheck(glTexSubImage2D(GL_TEXTURE_2D, 0, 0, i, rectangle.width, 1, GL_RGBA, GL_UNSIGNED_BYTE, pixels));
                pixels += 4 * width;
            }

            glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
            m_hasMipmap = false;

            // Force an OpenGL flush, so that the texture will appear updated
            // in all contexts immediately (solves problems in multi-threaded apps)
            glCheck(glFlush());

            return true;
        }
        else
        {
            return false;
        }
    }
}